

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-stack-opts.cpp
# Opt level: O1

void __thiscall wasm::StackIROptimizer::dce(StackIROptimizer *this)

{
  StackInst *pSVar1;
  uint uVar2;
  pointer ppSVar3;
  uint uVar4;
  ulong uVar5;
  uint uVar6;
  bool bVar7;
  
  ppSVar3 = (this->insts->super__Vector_base<wasm::StackInst_*,_std::allocator<wasm::StackInst_*>_>)
            ._M_impl.super__Vector_impl_data._M_start;
  if ((this->insts->super__Vector_base<wasm::StackInst_*,_std::allocator<wasm::StackInst_*>_>).
      _M_impl.super__Vector_impl_data._M_finish != ppSVar3) {
    uVar5 = 0;
    uVar6 = 1;
    bVar7 = false;
    do {
      pSVar1 = ppSVar3[uVar5];
      if (pSVar1 != (StackInst *)0x0) {
        if (bVar7) {
          uVar2 = pSVar1->op - BlockEnd;
          if ((uVar2 < 0xd) && ((0x17adU >> (uVar2 & 0x1f) & 1) != 0)) {
            bVar7 = false;
          }
          else {
            removeAt(this,uVar6 - 1);
          }
        }
        else if ((pSVar1->type).id == 1) {
          bVar7 = true;
        }
      }
      uVar5 = (ulong)uVar6;
      ppSVar3 = (this->insts->
                super__Vector_base<wasm::StackInst_*,_std::allocator<wasm::StackInst_*>_>)._M_impl.
                super__Vector_impl_data._M_start;
      uVar6 = uVar6 + 1;
    } while (uVar5 < (ulong)((long)(this->insts->
                                   super__Vector_base<wasm::StackInst_*,_std::allocator<wasm::StackInst_*>_>
                                   )._M_impl.super__Vector_impl_data._M_finish - (long)ppSVar3 >> 3)
            );
  }
  ppSVar3 = (this->insts->super__Vector_base<wasm::StackInst_*,_std::allocator<wasm::StackInst_*>_>)
            ._M_impl.super__Vector_impl_data._M_start;
  if (8 < (ulong)((long)(this->insts->
                        super__Vector_base<wasm::StackInst_*,_std::allocator<wasm::StackInst_*>_>).
                        _M_impl.super__Vector_impl_data._M_finish - (long)ppSVar3)) {
    uVar5 = 1;
    uVar6 = 0;
    do {
      pSVar1 = ppSVar3[uVar5];
      if (((pSVar1 != (StackInst *)0x0) && (pSVar1->op == Basic)) &&
         (uVar2 = uVar6, pSVar1->origin->_id == UnreachableId)) {
        do {
          uVar4 = uVar2;
          if (uVar4 == 0) {
            uVar4 = 0;
            break;
          }
          uVar2 = uVar4 - 1;
        } while (ppSVar3[uVar4] == (StackInst *)0x0);
        pSVar1 = ppSVar3[uVar4];
        if (((pSVar1 != (StackInst *)0x0) && (pSVar1->op == Basic)) &&
           (pSVar1->origin->_id == DropId)) {
          ppSVar3[uVar4] = (StackInst *)0x0;
        }
      }
      uVar5 = (ulong)((int)uVar5 + 1);
      ppSVar3 = (this->insts->
                super__Vector_base<wasm::StackInst_*,_std::allocator<wasm::StackInst_*>_>)._M_impl.
                super__Vector_impl_data._M_start;
      uVar6 = uVar6 + 1;
    } while (uVar5 < (ulong)((long)(this->insts->
                                   super__Vector_base<wasm::StackInst_*,_std::allocator<wasm::StackInst_*>_>
                                   )._M_impl.super__Vector_impl_data._M_finish - (long)ppSVar3 >> 3)
            );
  }
  return;
}

Assistant:

void StackIROptimizer::dce() {
  // Remove code after an unreachable instruction: anything after it, up to the
  // next control flow barrier, can simply be removed.
  bool inUnreachableCode = false;
  for (Index i = 0; i < insts.size(); i++) {
    auto* inst = insts[i];
    if (!inst) {
      continue;
    }
    if (inUnreachableCode) {
      // Does the unreachable code end here?
      if (isControlFlowBarrier(inst)) {
        inUnreachableCode = false;
      } else {
        // We can remove this.
        removeAt(i);
      }
    } else if (inst->type == Type::unreachable) {
      inUnreachableCode = true;
    }
  }

  // Remove code before an Unreachable. Consider this:
  //
  //  (drop
  //   ..
  //  )
  //  (unreachable)
  //
  // The drop is not needed, as the unreachable puts the stack in the
  // polymorphic state anyhow. Note that we don't need to optimize anything
  // other than a drop here, as in general the Binaryen IR DCE pass will handle
  // everything else. A drop followed by an unreachable is the only thing that
  // pass cannot handle, as the structured form of Binaryen IR does not allow
  // removing such a drop, and so we can only do it here in StackIR.
  //
  // TODO: We can look even further back, say if there is another drop of
  //       something before, then we can remove that drop as well. To do that
  //       we'd need to inspect the stack going backwards.
  for (Index i = 1; i < insts.size(); i++) {
    auto* inst = insts[i];
    if (!inst || inst->op != StackInst::Basic ||
        !inst->origin->is<Unreachable>()) {
      continue;
    }

    // Look back past nulls.
    Index j = i - 1;
    while (j > 0 && !insts[j]) {
      j--;
    }

    auto*& prev = insts[j];
    if (prev && prev->op == StackInst::Basic && prev->origin->is<Drop>()) {
      prev = nullptr;
    }
  }
}